

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmetrohash64.c
# Opt level: O1

void cmetrohash64_1(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  
  pauVar1 = (undefined1 (*) [16])(key + len);
  uVar4 = len + 0x60e25d3baf065edb + (ulong)seed * 0xc83a91e1;
  if (0x1f < len) {
    auVar9 = vpbroadcastq_avx512vl();
    auVar3 = vpmovzxdq_avx(ZEXT816(0x8648dbdbc83a91e1));
    auVar2 = vpmovsxdq_avx(ZEXT816(0x2f5870a57bdec03b));
    auVar11 = auVar9;
    do {
      auVar10 = vpmullq_avx512vl(auVar3,*(undefined1 (*) [16])key);
      auVar11 = vpaddq_avx(auVar10,auVar11);
      auVar10 = vpmullq_avx512vl(auVar2,*(undefined1 (*) [16])((long)key + 0x10));
      key = (uint8_t *)((long)key + 0x20);
      auVar11 = vprolq_avx512vl(auVar11,0x23);
      auVar11 = vpaddq_avx(auVar11,auVar9);
      auVar9 = vpaddq_avx(auVar10,auVar9);
      auVar9 = vprolq_avx512vl(auVar9,0x23);
      auVar9 = vpaddq_avx(auVar9,auVar11);
    } while (key <= pauVar1 + -2);
    uVar7 = vpextrq_avx(auVar9,1);
    uVar12 = auVar11._0_8_;
    uVar6 = vpextrq_avx(auVar11,1);
    uVar5 = (uVar7 + uVar12) * 0xc83a91e1 + uVar6;
    uVar8 = auVar9._0_8_ ^ (uVar5 >> 0x21 | uVar5 * 0x80000000) * 0x8648dbdb;
    uVar5 = (uVar8 + uVar6) * 0x8648dbdb + uVar12;
    uVar7 = (uVar5 >> 0x21 | uVar5 * 0x80000000) * 0xc83a91e1 ^ uVar7;
    uVar5 = (uVar8 + uVar12) * 0xc83a91e1 + uVar7;
    uVar8 = (uVar7 + uVar6) * 0x8648dbdb + uVar8;
    uVar4 = uVar4 + ((uVar5 >> 0x21 | uVar5 * 0x80000000) * 0x8648dbdb ^ uVar12 ^ uVar6 ^
                    (uVar8 >> 0x21 | uVar8 * 0x80000000) * 0xc83a91e1);
  }
  if (0xf < (long)pauVar1 - (long)key) {
    uVar5 = *(long *)*(undefined1 (*) [16])key * 0xc83a91e1 + uVar4;
    uVar7 = uVar5 >> 0x21 | uVar5 * 0x80000000;
    uVar5 = *(long *)(*(undefined1 (*) [16])key + 8) * 0x8648dbdb + uVar4;
    key = (uint8_t *)((long)key + 0x10);
    uVar5 = uVar5 >> 0x21 | uVar5 * 0x80000000;
    uVar4 = uVar4 + ((uVar5 * -0x3981893f20000000 | uVar5 * 0x16e8b05e33f3b607 >> 0x23) +
                     ((uVar7 * 0x4645c8cf60000000 | uVar7 * 0x6907a4ca322e467b >> 0x23) +
                      uVar5 * 0x7bdec03b ^ uVar7 * 0x8648dbdb) ^ uVar5 * 0x7bdec03b);
  }
  if (7 < (long)pauVar1 - (long)key) {
    uVar4 = *(long *)*(undefined1 (*) [16])key * 0x2f5870a5 + uVar4;
    key = *(undefined1 (*) [16])key + 8;
    uVar4 = (uVar4 >> 0x21 | uVar4 * 0x80000000) * 0x8648dbdb ^ uVar4;
  }
  if (3 < (long)pauVar1 - (long)key) {
    uVar4 = (ulong)*(uint *)*(undefined1 (*) [16])key * 0x2f5870a5 + uVar4;
    key = *(undefined1 (*) [16])key + 4;
    uVar4 = (uVar4 >> 0xf | uVar4 << 0x31) * 0x8648dbdb ^ uVar4;
  }
  if (1 < (long)pauVar1 - (long)key) {
    uVar4 = (ulong)*(ushort *)*(undefined1 (*) [16])key * 0x2f5870a5 + uVar4;
    key = *(undefined1 (*) [16])key + 2;
    uVar4 = (uVar4 >> 0xd | uVar4 << 0x33) * 0x8648dbdb ^ uVar4;
  }
  if (pauVar1 != (undefined1 (*) [16])key && -1 < (long)pauVar1 - (long)key) {
    uVar4 = (ulong)(byte)(*(undefined1 (*) [16])key)[0] * 0x2f5870a5 + uVar4;
    uVar4 = (uVar4 >> 0x19 | uVar4 << 0x27) * 0x8648dbdb ^ uVar4;
  }
  uVar4 = (uVar4 >> 0x21 | uVar4 << 0x1f) ^ uVar4;
  uVar5 = uVar4 * 0xc83a91e1;
  *(ulong *)out = (uVar4 * 0x641d48f080000000 | uVar5 >> 0x21) ^ uVar5;
  return;
}

Assistant:

void cmetrohash64_1(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;
    
    if (len >= 32)
    {
        uint64_t v[4];
        v[0] = hash;
        v[1] = hash;
        v[2] = hash;
        v[3] = hash;
        
        do
        {
            v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0],29) + v[2];
            v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1],29) + v[3];
            v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2],29) + v[0];
            v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 33) * k1;
        v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 33) * k0;
        v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 33) * k1;
        v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 33) * k0;
        hash += v[0] ^ v[1];
    }
    
    if ((end - ptr) >= 16)
    {
        uint64_t v0 = hash + (cread_u64(ptr) * k0); ptr += 8; v0 = crotate_right(v0,33) * k1;
        uint64_t v1 = hash + (cread_u64(ptr) * k1); ptr += 8; v1 = crotate_right(v1,33) * k2;
        v0 ^= crotate_right(v0 * k0, 35) + v1;
        v1 ^= crotate_right(v1 * k3, 35) + v0;
        hash += v1;
    }
    
    if ((end - ptr) >= 8)
    {
        hash += cread_u64(ptr) * k3; ptr += 8;
        hash ^= crotate_right(hash, 33) * k1;
        
    }
    
    if ((end - ptr) >= 4)
    {
        hash += cread_u32(ptr) * k3; ptr += 4;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 2)
    {
        hash += cread_u16(ptr) * k3; ptr += 2;
        hash ^= crotate_right(hash, 13) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        hash += cread_u8 (ptr) * k3;
        hash ^= crotate_right(hash, 25) * k1;
    }
    
    hash ^= crotate_right(hash, 33);
    hash *= k0;
    hash ^= crotate_right(hash, 33);

    memcpy(out, &hash, 8);
}